

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clu.c
# Opt level: O0

CLU * CLU_NewFromFile(FILE *fp,LPStatus *status)

{
  _Bool _Var1;
  uint8_t *dest;
  int local_34;
  int i;
  uint8_t *cluptr;
  CLU *clu;
  LPStatus *status_local;
  FILE *fp_local;
  
  fp_local = (FILE *)malloc(0x300);
  if (fp_local == (FILE *)0x0) {
    *status = LUNAPURPURA_ERROR;
    fp_local = (FILE *)0x0;
  }
  else {
    _Var1 = ValidateMagicF(fp,CLU_MAGIC,8);
    if (_Var1) {
      for (local_34 = 0; local_34 < 0x100; local_34 = local_34 + 1) {
        memset((void *)((long)&fp_local->_flags + (long)local_34 * 3),0,3);
        dest = (uint8_t *)((long)&fp_local->_flags + (long)local_34 * 3);
        fseek((FILE *)fp,2,1);
        ReadUint8(fp,1,dest);
        fseek((FILE *)fp,1,1);
        ReadUint8(fp,1,dest + 1);
        fseek((FILE *)fp,1,1);
        ReadUint8(fp,1,dest + 2);
        fseek((FILE *)fp,1,1);
      }
      *status = LUNAPURPURA_OK;
    }
    else {
      *status = LUNAPURPURA_BADMAGIC;
      fp_local = (FILE *)0x0;
    }
  }
  return (CLU *)fp_local;
}

Assistant:

CLU *
CLU_NewFromFile(FILE *fp, LPStatus *status)
{
	CLU *clu = malloc(sizeof(CLU));

	if (!clu) {
		*status = LUNAPURPURA_ERROR;
		return NULL;
	}

	uint8_t *cluptr = NULL;

	if (!ValidateMagicF(fp, CLU_MAGIC, CLU_MAGIC_LEN)) {
		*status = LUNAPURPURA_BADMAGIC;
		return NULL;
	}

	for (int i = 0; i < CLU_NELEMENTS; i++) {
		memset(clu->array[i], 0, sizeof(clu->array[i]));
		cluptr = clu->array[i];

		fseek(fp, 2L, SEEK_CUR); /* skip marker */
		ReadUint8(fp, 1, cluptr); /* R */

		cluptr++;
		fseek(fp, 1L, SEEK_CUR);
		ReadUint8(fp, 1, cluptr); /* G */

		cluptr++;
		fseek(fp, 1L, SEEK_CUR);
		ReadUint8(fp, 1, cluptr); /* B */

		fseek(fp, 1L, SEEK_CUR); /* go to next marker */
	}

	*status = LUNAPURPURA_OK;
	return clu;
}